

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::ParseNamespace(Parser *this)

{
  pointer *pppNVar1;
  Namespace *pNVar2;
  CheckedError *ce;
  Parser *in_RSI;
  Namespace *ns;
  
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
    CheckedError::~CheckedError((CheckedError *)this);
    ns = (Namespace *)operator_new(0x20);
    (ns->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ns->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ns->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ns->from_table = 0;
    std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::push_back
              (&in_RSI->namespaces_,&ns);
    if ((in_RSI->super_ParserState).token_ == 0x3b) {
LAB_00115b84:
      pppNVar1 = &(in_RSI->namespaces_).
                  super__Vector_base<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + -1;
      pNVar2 = UniqueNamespace(in_RSI,ns);
      in_RSI->current_namespace_ = pNVar2;
      Expect(this,(int)in_RSI);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        CheckedError::~CheckedError((CheckedError *)this);
        *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
      }
    }
    else {
      while( true ) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&ns->components,&(in_RSI->super_ParserState).attribute_);
        Expect(this,(int)in_RSI);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
        CheckedError::~CheckedError((CheckedError *)this);
        if ((in_RSI->super_ParserState).token_ != 0x2e) goto LAB_00115b84;
        Next(this);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
        CheckedError::~CheckedError((CheckedError *)this);
      }
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseNamespace() {
  NEXT();
  auto ns = new Namespace();
  namespaces_.push_back(ns);  // Store it here to not leak upon error.
  if (token_ != ';') {
    for (;;) {
      ns->components.push_back(attribute_);
      EXPECT(kTokenIdentifier);
      if (Is('.')) NEXT() else break;
    }
  }
  namespaces_.pop_back();
  current_namespace_ = UniqueNamespace(ns);
  EXPECT(';');
  return NoError();
}